

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void transaction_tests::ReplaceRedeemScript(CScript *script,CScript *redeemScript)

{
  byte bVar1;
  pointer pbVar2;
  pointer pvVar3;
  uint uVar4;
  opcodetype opcode;
  valtype *v;
  pointer pvVar5;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  allocator_type local_79;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack;
  undefined1 local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._0_8_ = &PTR_CheckECDSASignature_0113e2b0;
  EvalScript(&stack,script,2,(BaseSignatureChecker *)local_58,BASE,(ScriptError *)0x0);
  if (stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("stack.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x207,"void transaction_tests::ReplaceRedeemScript(CScript &, const CScript &)");
  }
  uVar4 = (redeemScript->super_CScriptBase)._size;
  if (0x1c < uVar4) {
    redeemScript = (CScript *)(redeemScript->super_CScriptBase)._union.indirect_contents.indirect;
    uVar4 = uVar4 - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_58,
             (const_iterator)redeemScript,(uchar *)((long)redeemScript + (long)(int)uVar4),&local_79
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1,(CScript *)local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  pvVar3 = stack.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58._0_8_ = (_func_int **)0x0;
  local_58._8_8_ = 0;
  pvVar5 = stack.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pvVar5 == pvVar3) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&script->super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&stack);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
        __stack_chk_fail();
      }
      return;
    }
    pbVar2 = (pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    b._M_extent._M_extent_value =
         (long)(pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pbVar2;
    if (b._M_extent._M_extent_value == 0) {
      opcode = OP_0;
LAB_00536faa:
      CScript::operator<<((CScript *)local_58,opcode);
    }
    else {
      if ((b._M_extent._M_extent_value == 1) && (bVar1 = *pbVar2, bVar1 != 0)) {
        if (bVar1 < 0x11) {
          opcode = CScript::EncodeOP_N((uint)bVar1);
        }
        else {
          opcode = OP_1NEGATE;
          if (bVar1 != 0x81) goto LAB_00536fc0;
        }
        goto LAB_00536faa;
      }
LAB_00536fc0:
      b._M_ptr = pbVar2;
      CScript::operator<<((CScript *)local_58,b);
    }
    pvVar5 = pvVar5 + 1;
  } while( true );
}

Assistant:

static void ReplaceRedeemScript(CScript& script, const CScript& redeemScript)
{
    std::vector<valtype> stack;
    EvalScript(stack, script, SCRIPT_VERIFY_STRICTENC, BaseSignatureChecker(), SigVersion::BASE);
    assert(stack.size() > 0);
    stack.back() = std::vector<unsigned char>(redeemScript.begin(), redeemScript.end());
    script = PushAll(stack);
}